

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxuUpdate.c
# Opt level: O0

void Fxu_UpdateDoublePairs(Fxu_Matrix *p,Fxu_Double *pDouble,Fxu_Var *pVar)

{
  char *pItem;
  Fxu_Cube *local_50;
  Fxu_Cube *local_48;
  int local_3c;
  int i;
  Fxu_Cube *pCubeRem;
  Fxu_Cube *pCubeUse;
  Fxu_Pair *pPair;
  Fxu_Var *pVar_local;
  Fxu_Double *pDouble_local;
  Fxu_Matrix *p_local;
  
  Fxu_UpdatePairsSort(p,pDouble);
  local_3c = 0;
  while( true ) {
    if (p->vPairs->nSize <= local_3c) {
      p->vPairs->nSize = 0;
      return;
    }
    pItem = (char *)p->vPairs->pArray[local_3c];
    if (*(int *)(pItem + 0x28) < *(int *)(pItem + 0x2c)) {
      local_48 = *(Fxu_Cube **)(pItem + 0x18);
    }
    else {
      local_48 = *(Fxu_Cube **)(pItem + 0x20);
    }
    if (*(int *)(pItem + 0x2c) < *(int *)(pItem + 0x28)) {
      local_50 = *(Fxu_Cube **)(pItem + 0x18);
    }
    else {
      local_50 = *(Fxu_Cube **)(pItem + 0x20);
    }
    if (local_48->pOrder != (Fxu_Cube *)0x0) {
      __assert_fail("pCubeUse->pOrder == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/opt/fxu/fxuUpdate.c"
                    ,0x12f,"void Fxu_UpdateDoublePairs(Fxu_Matrix *, Fxu_Double *, Fxu_Var *)");
    }
    *p->ppTailCubes = local_48;
    p->ppTailCubes = &local_48->pOrder;
    local_48->pOrder = (Fxu_Cube *)0x1;
    Fxu_UpdateMatrixDoubleClean(p,local_48,local_50);
    Fxu_MatrixAddLiteral(p,local_48,pVar);
    if ((local_48->lLits).nItems != *(int *)(pItem + 8) + 1) {
      __assert_fail("pCubeUse->lLits.nItems == pPair->nBase + 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/opt/fxu/fxuUpdate.c"
                    ,0x137,"void Fxu_UpdateDoublePairs(Fxu_Matrix *, Fxu_Double *, Fxu_Var *)");
    }
    if ((local_50->lLits).nItems != 0) break;
    Fxu_UpdateCleanOldDoubles(p,pDouble,local_48);
    Fxu_UpdateCleanOldDoubles(p,pDouble,local_50);
    if (pItem != (char *)0x0) {
      Fxu_MemRecycle(p,pItem,0x40);
    }
    local_3c = local_3c + 1;
  }
  __assert_fail("pCubeRem->lLits.nItems == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/opt/fxu/fxuUpdate.c"
                ,0x138,"void Fxu_UpdateDoublePairs(Fxu_Matrix *, Fxu_Double *, Fxu_Var *)");
}

Assistant:

void Fxu_UpdateDoublePairs( Fxu_Matrix * p, Fxu_Double * pDouble, Fxu_Var * pVar )
{
    Fxu_Pair * pPair;
    Fxu_Cube * pCubeUse, * pCubeRem;
    int i;

    // collect and sort the pairs
    Fxu_UpdatePairsSort( p, pDouble );
//    for ( i = 0; i < p->nPairsTemp; i++ )
    for ( i = 0; i < p->vPairs->nSize; i++ )
    {
        // get the pair
//        pPair = p->pPairsTemp[i];
        pPair = (Fxu_Pair *)p->vPairs->pArray[i];
        // out of the two cubes, select the one which comes earlier
        pCubeUse = Fxu_PairMinCube( pPair );
        pCubeRem = Fxu_PairMaxCube( pPair );
        // collect the affected cube
        assert( pCubeUse->pOrder == NULL );
        Fxu_MatrixRingCubesAdd( p, pCubeUse );

        // remove some literals from pCubeUse and all literals from pCubeRem
        Fxu_UpdateMatrixDoubleClean( p, pCubeUse, pCubeRem );
        // add a literal that depends on the new variable
        Fxu_MatrixAddLiteral( p, pCubeUse, pVar );    
        // check the literal count
        assert( pCubeUse->lLits.nItems == pPair->nBase + 1 );
        assert( pCubeRem->lLits.nItems == 0 );

        // update the divisors by removing useless pairs
        Fxu_UpdateCleanOldDoubles( p, pDouble, pCubeUse );
        Fxu_UpdateCleanOldDoubles( p, pDouble, pCubeRem );
        // remove the pair
        MEM_FREE_FXU( p, Fxu_Pair, 1, pPair );
    }
    p->vPairs->nSize = 0;
}